

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

disp_binder_unique_ptr_t __thiscall
so_5::disp::active_group::impl::real_private_dispatcher_t::binder
          (real_private_dispatcher_t *this,string *group_name)

{
  atomic_refcounted_t *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t> local_18;
  _func_int **local_10;
  
  LOCK();
  group_name->_M_string_length = group_name->_M_string_length + 1;
  UNLOCK();
  local_18.m_obj = (private_dispatcher_t *)group_name;
  stdcpp::
  make_unique<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,so_5::disp::active_group::impl::proxy_dispatcher_t&,std::__cxx11::string_const&>
            ((stdcpp *)&local_10,&local_18,
             (proxy_dispatcher_t *)(group_name->field_2)._M_allocated_capacity,in_RDX);
  (this->super_private_dispatcher_t)._vptr_private_dispatcher_t = local_10;
  local_10 = (_func_int **)0x0;
  if ((string *)local_18.m_obj != (string *)0x0) {
    LOCK();
    paVar1 = &(local_18.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       ((string *)local_18.m_obj != (string *)0x0)) {
      (**(code **)(((_Alloc_hider *)&(local_18.m_obj)->_vptr_private_dispatcher_t)->_M_p + 8))();
    }
  }
  return (__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
         )(__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
           )this;
}

Assistant:

virtual so_5::disp_binder_unique_ptr_t
		binder( const std::string & group_name ) override
			{
				return so_5::stdcpp::make_unique< private_dispatcher_binder_t >(
						private_dispatcher_handle_t( this ),
						*m_disp,
						group_name );
			}